

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_kotlin_kmp.cpp
# Opt level: O3

string * __thiscall
flatbuffers::kotlin::KotlinKMPGenerator::TypeInNameSpace
          (string *__return_storage_ptr__,KotlinKMPGenerator *this,Definition *def,string *suffix)

{
  Namespace *ns;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  ns = def->defined_namespace;
  std::operator+(&local_40,&def->name,suffix);
  TypeInNameSpace(__return_storage_ptr__,this,ns,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string TypeInNameSpace(const Definition &def,
                              const std::string &suffix = "") const {
    return TypeInNameSpace(def.defined_namespace, def.name + suffix);
  }